

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCheckIN(Parse *pParse,Expr *pIn)

{
  Select *pExpr;
  u8 uVar1;
  int iVar2;
  Select *pSVar3;
  
  pExpr = (Select *)pIn->pLeft;
  uVar1 = pExpr->op;
  if (uVar1 == 0xb0) {
    uVar1 = *(u8 *)&pExpr->nSelectRow;
  }
  pSVar3 = pExpr;
  if (uVar1 != 0xb1) {
    iVar2 = 1;
    if (uVar1 != 0x8b) goto LAB_0017ccc2;
    pSVar3 = ((anon_union_8_2_a01b6dbf_for_x *)&pExpr->pEList)->pSelect;
  }
  iVar2 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar3->pEList)->pList->nExpr;
LAB_0017ccc2:
  if (((pIn->flags & 0x1000) == 0) || (pParse->db->mallocFailed != '\0')) {
    if (iVar2 != 1) {
      sqlite3VectorErrorMsg(pParse,(Expr *)pExpr);
      return 1;
    }
  }
  else if (iVar2 != ((pIn->x).pSelect)->pEList->nExpr) {
    if (pParse->nErr != 0) {
      return 1;
    }
    sqlite3ErrorMsg(pParse,"sub-select returns %d columns - expected %d");
    return 1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCheckIN(Parse *pParse, Expr *pIn){
  int nVector = sqlite3ExprVectorSize(pIn->pLeft);
  if( ExprUseXSelect(pIn) && !pParse->db->mallocFailed ){
    if( nVector!=pIn->x.pSelect->pEList->nExpr ){
      sqlite3SubselectError(pParse, pIn->x.pSelect->pEList->nExpr, nVector);
      return 1;
    }
  }else if( nVector!=1 ){
    sqlite3VectorErrorMsg(pParse, pIn->pLeft);
    return 1;
  }
  return 0;
}